

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,duckdb::interval_t,duckdb::GreaterThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  const_reference pvVar9;
  long lVar10;
  idx_t iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  idx_t iVar16;
  long lVar17;
  idx_t iVar18;
  bool bVar19;
  value_type rhs_offset_in_row;
  interval_t *lhs_data;
  idx_t entry_idx;
  uchar **rhs_locations;
  idx_t local_78;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar9;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      local_78 = 0;
      iVar18 = 0;
      do {
        iVar16 = iVar18;
        if (psVar6 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar6[iVar18];
        }
        iVar11 = iVar16;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar16];
        }
        lVar17 = *(long *)(pdVar4 + iVar16 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar17 + (col_idx >> 3))) != 0) {
          lVar10 = iVar11 * 0x10;
          lVar8 = *(long *)(lVar17 + 8 + vVar5);
          lVar13 = (long)*(int *)(pdVar3 + lVar10 + 4) +
                   *(long *)(pdVar3 + lVar10 + 8) / 86400000000;
          lVar15 = lVar13 % 0x1e;
          lVar12 = (long)*(int *)(pdVar3 + lVar10) + lVar13 / 0x1e;
          lVar14 = (*(long *)(lVar17 + vVar5) >> 0x20) + lVar8 / 86400000000;
          lVar13 = lVar14 % 0x1e;
          lVar17 = (long)(int)*(long *)(lVar17 + vVar5) + lVar14 / 0x1e;
          if ((lVar17 < lVar12) ||
             ((lVar17 <= lVar12 &&
              ((lVar13 < lVar15 ||
               ((lVar13 <= lVar15 &&
                (lVar8 % 86400000000 < *(long *)(pdVar3 + lVar10 + 8) % 86400000000)))))))) {
            psVar6[local_78] = (sel_t)iVar16;
            local_78 = local_78 + 1;
          }
        }
        iVar18 = iVar18 + 1;
      } while (count != iVar18);
      return local_78;
    }
  }
  else if (count != 0) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    local_78 = 0;
    iVar18 = 0;
    do {
      iVar16 = iVar18;
      if (psVar6 != (sel_t *)0x0) {
        iVar16 = (idx_t)psVar6[iVar18];
      }
      iVar11 = iVar16;
      if (psVar7 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar7[iVar16];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar19 = false;
      }
      else {
        bVar19 = (puVar1[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0;
      }
      if ((!bVar19) &&
         (lVar17 = *(long *)(pdVar4 + iVar16 * 8),
         ((uint)*(byte *)(lVar17 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) != 0)) {
        lVar15 = iVar11 * 0x10;
        lVar8 = *(long *)(lVar17 + 8 + vVar5);
        lVar13 = (long)*(int *)(pdVar3 + lVar15 + 4) + *(long *)(pdVar3 + lVar15 + 8) / 86400000000;
        lVar10 = lVar13 % 0x1e;
        lVar14 = (long)*(int *)(pdVar3 + lVar15) + lVar13 / 0x1e;
        lVar12 = (*(long *)(lVar17 + vVar5) >> 0x20) + lVar8 / 86400000000;
        lVar13 = lVar12 % 0x1e;
        lVar17 = (long)(int)*(long *)(lVar17 + vVar5) + lVar12 / 0x1e;
        if ((lVar17 < lVar14) ||
           ((lVar17 <= lVar14 &&
            ((lVar13 < lVar10 ||
             ((lVar13 <= lVar10 &&
              (lVar8 % 86400000000 < *(long *)(pdVar3 + lVar15 + 8) % 86400000000)))))))) {
          psVar6[local_78] = (sel_t)iVar16;
          local_78 = local_78 + 1;
        }
      }
      iVar18 = iVar18 + 1;
    } while (count != iVar18);
    return local_78;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}